

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

int lj_ir_strcmp(GCstr *a,GCstr *b,IROp op)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = lj_str_cmp(a,b);
  switch(op) {
  case IR_GE:
    uVar2 = ~uVar2;
  case IR_LT:
    return uVar2 >> 0x1f;
  case IR_LE:
    bVar1 = (int)uVar2 < 1;
    break;
  case IR_GT:
    bVar1 = 0 < (int)uVar2;
    break;
  default:
    return 0;
  }
  return (uint)bVar1;
}

Assistant:

int lj_ir_strcmp(GCstr *a, GCstr *b, IROp op)
{
  int res = lj_str_cmp(a, b);
  switch (op) {
  case IR_LT: return (res < 0);
  case IR_GE: return (res >= 0);
  case IR_LE: return (res <= 0);
  case IR_GT: return (res > 0);
  default: lua_assert(0); return 0;
  }
}